

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_7::Validator::CheckFuncSignature
          (Validator *this,Location *loc,FuncDeclaration *decl)

{
  bool bVar1;
  Result result;
  FuncType *local_28;
  FuncType *func_type;
  FuncDeclaration *decl_local;
  Location *loc_local;
  Validator *this_local;
  
  if ((decl->has_func_type & 1U) != 0) {
    func_type = (FuncType *)decl;
    decl_local = (FuncDeclaration *)loc;
    loc_local = (Location *)this;
    result = CheckFuncTypeVar(this,&decl->type_var,&local_28);
    bVar1 = Succeeded(result);
    if (bVar1) {
      CheckTypes(this,(Location *)decl_local,(TypeVector *)((long)&func_type[1].name.field_2 + 8),
                 &(local_28->sig).result_types,"function","result");
      CheckTypes(this,(Location *)decl_local,(TypeVector *)(func_type + 1),
                 &(local_28->sig).param_types,"function","argument");
    }
  }
  return;
}

Assistant:

void Validator::CheckFuncSignature(const Location* loc,
                                   const FuncDeclaration& decl) {
  if (decl.has_func_type) {
    const FuncType* func_type;
    if (Succeeded(CheckFuncTypeVar(&decl.type_var, &func_type))) {
      CheckTypes(loc, decl.sig.result_types, func_type->sig.result_types,
                 "function", "result");
      CheckTypes(loc, decl.sig.param_types, func_type->sig.param_types,
                 "function", "argument");
    }
  }
}